

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O3

int ssl_parse_max_fragment_length_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  
  if ((len == 1) && (*buf < 5)) {
    ssl->session_negotiate->mfl_code = *buf;
    iVar1 = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x159,"bad client hello message");
    mbedtls_ssl_send_alert_message(ssl,'\x02','/');
    iVar1 = -0x6600;
  }
  return iVar1;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_max_fragment_length_ext(mbedtls_ssl_context *ssl,
                                             const unsigned char *buf,
                                             size_t len)
{
    /*
     * server should use the extension only if we did,
     * and if so the server's value should match ours (and len is always 1)
     */
    if (ssl->conf->mfl_code == MBEDTLS_SSL_MAX_FRAG_LEN_NONE ||
        len != 1 ||
        buf[0] != ssl->conf->mfl_code) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("non-matching max fragment length extension"));
        mbedtls_ssl_send_alert_message(
            ssl,
            MBEDTLS_SSL_ALERT_LEVEL_FATAL,
            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER);
        return MBEDTLS_ERR_SSL_ILLEGAL_PARAMETER;
    }

    return 0;
}